

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall c4::yml::Parser::_handle_map_blck(Parser *this)

{
  csubstr *pcVar1;
  char cVar2;
  uint uVar3;
  State *pSVar4;
  code *pcVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  Location LVar15;
  Location LVar16;
  Location LVar17;
  Location LVar18;
  csubstr val;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  undefined1 uVar22;
  int iVar23;
  size_t sVar24;
  char *pcVar25;
  size_t ahead;
  long lVar26;
  ulong uVar27;
  csubstr fmt;
  ro_substr chars;
  ro_substr chars_00;
  csubstr rem;
  bool is_quoted;
  char msg [30];
  csubstr s;
  bool local_229;
  csubstr local_228;
  basic_substring<const_char> local_218;
  undefined6 uStack_208;
  undefined1 uStack_202;
  undefined1 uStack_201;
  undefined6 uStack_200;
  undefined1 uStack_1fa;
  undefined4 uStack_1f9;
  undefined5 uStack_1f5;
  undefined2 uStack_1f0;
  undefined1 uStack_1ee;
  undefined5 uStack_1ed;
  undefined2 uStack_1e8;
  undefined1 uStack_1e6;
  undefined7 uStack_1e5;
  undefined1 uStack_1de;
  csubstr local_1d8;
  undefined8 local_1c8;
  char *pcStack_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  char *pcStack_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  char *pcStack_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  char *pcStack_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  char *pcStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  char *pcStack_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  local_228 = (this->m_state->line_contents).rem;
  if ((this->m_state->flags & 4) == 0) {
    uStack_208 = 0x6c6c615f7361;
    uStack_202 = 0x28;
    uStack_201 = 0x52;
    uStack_200 = 0x292950414d;
    local_218.str = (char *)0x6166206b63656863;
    local_218.len._0_6_ = 0x203a64656c69;
    local_218.len._6_1_ = 0x28;
    local_218.len._7_1_ = 0x68;
    if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
      pcVar5 = (code *)swi(3);
      uVar22 = (*pcVar5)();
      return (bool)uVar22;
    }
    local_48 = 0;
    uStack_40 = 0x703e;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x703e) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x703e) << 0x40,8);
    LVar6.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_218,0x1e,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((this->m_state->flags & 0x10) != 0) {
    uStack_208 = 0x6e6f6e5f7361;
    uStack_202 = 0x65;
    uStack_201 = 0x28;
    uStack_200 = 0x2929574f4c46;
    uStack_1fa = 0;
    local_218.str = (char *)0x6166206b63656863;
    local_218.len._0_6_ = 0x203a64656c69;
    local_218.len._6_1_ = 0x28;
    local_218.len._7_1_ = 0x68;
    if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
      pcVar5 = (code *)swi(3);
      uVar22 = (*pcVar5)();
      return (bool)uVar22;
    }
    local_70 = 0;
    uStack_68 = 0x703f;
    local_60 = 0;
    pcStack_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x65;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x703f) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x703f) << 0x40,8);
    LVar7.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_218,0x1f,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((local_228.len != 0) && (*local_228.str == '#')) {
    _scan_comment(this);
    return true;
  }
  uVar3 = this->m_state->flags;
  if ((uVar3 >> 8 & 1) != 0) {
    if ((uVar3 & 0x40) != 0) {
      uStack_208 = 0x6e6f6e5f7361;
      uStack_202 = 0x65;
      uStack_201 = 0x28;
      uStack_200 = 0x292959454b52;
      uStack_1fa = 0;
      local_218.str = (char *)0x6166206b63656863;
      local_218.len._0_6_ = 0x203a64656c69;
      local_218.len._6_1_ = 0x28;
      local_218.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
        pcVar5 = (code *)swi(3);
        uVar22 = (*pcVar5)();
        return (bool)uVar22;
      }
      local_98 = 0;
      uStack_90 = 0x704a;
      local_88 = 0;
      pcStack_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_78 = 0x65;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x704a) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x704a) << 0x40,8);
      LVar8.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar8.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_218,0x1f,LVar8,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((this->m_state->flags & 0x80) != 0) {
      uStack_208 = 0x6e6f6e5f7361;
      uStack_202 = 0x65;
      uStack_201 = 0x28;
      uStack_200 = 0x29294c415652;
      uStack_1fa = 0;
      local_218.str = (char *)0x6166206b63656863;
      local_218.len._0_6_ = 0x203a64656c69;
      local_218.len._6_1_ = 0x28;
      local_218.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
        pcVar5 = (code *)swi(3);
        uVar22 = (*pcVar5)();
        return (bool)uVar22;
      }
      local_c0 = 0;
      uStack_b8 = 0x704b;
      local_b0 = 0;
      pcStack_a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_a0 = 0x65;
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x704b) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x704b) << 0x40,8);
      LVar9.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar9.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_218,0x1f,LVar9,(this->m_stack).m_callbacks.m_user_data);
    }
    this->m_state->flags = this->m_state->flags & 0xfffffebfU | 0x40;
  }
  bVar21 = _handle_indentation(this);
  if (bVar21) {
    return true;
  }
  uVar3 = this->m_state->flags;
  if ((uVar3 & 0x40) != 0) {
    if ((uVar3 >> 8 & 1) != 0) {
      uStack_208 = 0x6e6f6e5f7361;
      uStack_202 = 0x65;
      uStack_201 = 0x28;
      uStack_200 = 0x292954584e52;
      uStack_1fa = 0;
      local_218.str = (char *)0x6166206b63656863;
      local_218.len._0_6_ = 0x203a64656c69;
      local_218.len._6_1_ = 0x28;
      local_218.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
        pcVar5 = (code *)swi(3);
        uVar22 = (*pcVar5)();
        return (bool)uVar22;
      }
      local_e8 = 0;
      uStack_e0 = 0x7058;
      local_d8 = 0;
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8 = 0x65;
      LVar10.super_LineCol.col = 0;
      LVar10.super_LineCol.offset = SUB168(ZEXT816(0x7058) << 0x40,0);
      LVar10.super_LineCol.line = SUB168(ZEXT816(0x7058) << 0x40,8);
      LVar10.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar10.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_218,0x1f,LVar10,(this->m_stack).m_callbacks.m_user_data);
    }
    if ((this->m_state->flags & 0x80) != 0) {
      uStack_208 = 0x6e6f6e5f7361;
      uStack_202 = 0x65;
      uStack_201 = 0x28;
      uStack_200 = 0x29294c415652;
      uStack_1fa = 0;
      local_218.str = (char *)0x6166206b63656863;
      local_218.len._0_6_ = 0x203a64656c69;
      local_218.len._6_1_ = 0x28;
      local_218.len._7_1_ = 0x68;
      if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
        pcVar5 = (code *)swi(3);
        uVar22 = (*pcVar5)();
        return (bool)uVar22;
      }
      local_110 = 0;
      uStack_108 = 0x7059;
      local_100 = 0;
      pcStack_f8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_f0 = 0x65;
      LVar11.super_LineCol.col = 0;
      LVar11.super_LineCol.offset = SUB168(ZEXT816(0x7059) << 0x40,0);
      LVar11.super_LineCol.line = SUB168(ZEXT816(0x7059) << 0x40,8);
      LVar11.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar11.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_218,0x1f,LVar11,(this->m_stack).m_callbacks.m_user_data);
    }
    bVar21 = _scan_scalar_map_blck(this,&local_228,&local_229);
    if (bVar21) {
      if ((~this->m_state->flags & 0x220U) == 0) {
        pcVar25 = (this->m_buf).str;
        if ((local_228.str + -1 < pcVar25) || (pcVar25 + (this->m_buf).len < local_228.str + -1)) {
          uStack_1e8 = 0x7562;
          uStack_1e6 = 0x66;
          uStack_1e5 = 0x292928646e652e;
          uStack_1de = 0;
          uStack_1f5 = 0x7320262620;
          uStack_1f0 = 0x7274;
          uStack_1ee = 0x20;
          uStack_1ed = 0x5f6d203d3c;
          uStack_208 = 0x203d3e207274;
          uStack_202 = 0x6d;
          uStack_201 = 0x5f;
          uStack_200 = 0x65622e667562;
          uStack_1fa = 0x67;
          uStack_1f9 = 0x29286e69;
          local_218.str = (char *)0x6166206b63656863;
          local_218.len._0_6_ = 0x203a64656c69;
          local_218.len._6_1_ = 0x28;
          local_218.len._7_1_ = 0x73;
          if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
            pcVar5 = (code *)swi(3);
            uVar22 = (*pcVar5)();
            return (bool)uVar22;
          }
          local_1d8.str = (char *)0x0;
          local_1d8.len = 0x5e96;
          local_1c8 = 0;
          pcStack_1c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1b8 = 0x65;
          LVar12.super_LineCol.col = 0;
          LVar12.super_LineCol.offset = SUB168(ZEXT816(0x5e96) << 0x40,0);
          LVar12.super_LineCol.line = SUB168(ZEXT816(0x5e96) << 0x40,8);
          LVar12.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar12.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_218,0x3b,LVar12,(this->m_stack).m_callbacks.m_user_data);
        }
        _append_key_val(this,(csubstr)ZEXT816(0),0);
      }
      _store_scalar(this,local_228,(uint)local_229);
      if ((~this->m_state->flags & 0x820U) == 0) {
        pcVar25 = (this->m_buf).str;
        if ((local_228.str < pcVar25) || (pcVar25 + (this->m_buf).len < local_228.str)) {
          uStack_1e8 = 0x7562;
          uStack_1e6 = 0x66;
          uStack_1e5 = 0x292928646e652e;
          uStack_1de = 0;
          uStack_1f5 = 0x7320262620;
          uStack_1f0 = 0x7274;
          uStack_1ee = 0x20;
          uStack_1ed = 0x5f6d203d3c;
          uStack_208 = 0x203d3e207274;
          uStack_202 = 0x6d;
          uStack_201 = 0x5f;
          uStack_200 = 0x65622e667562;
          uStack_1fa = 0x67;
          uStack_1f9 = 0x29286e69;
          local_218.str = (char *)0x6166206b63656863;
          local_218.len._0_6_ = 0x203a64656c69;
          local_218.len._6_1_ = 0x28;
          local_218.len._7_1_ = 0x73;
          if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
            pcVar5 = (code *)swi(3);
            uVar22 = (*pcVar5)();
            return (bool)uVar22;
          }
          local_1d8.str = (char *)0x0;
          local_1d8.len = 0x5e96;
          local_1c8 = 0;
          pcStack_1c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_1b8 = 0x65;
          LVar13.super_LineCol.col = 0;
          LVar13.super_LineCol.offset = SUB168(ZEXT816(0x5e96) << 0x40,0);
          LVar13.super_LineCol.line = SUB168(ZEXT816(0x5e96) << 0x40,8);
          LVar13.name.str =
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          LVar13.name.len = 0x65;
          (*(this->m_stack).m_callbacks.m_error)
                    ((char *)&local_218,0x3b,LVar13,(this->m_stack).m_callbacks.m_user_data);
        }
        _append_key_val(this,(csubstr)ZEXT816(0),0);
      }
      pSVar4 = this->m_state;
      local_228.str = (pSVar4->line_contents).rem.str;
      local_228.len = (pSVar4->line_contents).rem.len;
      if (local_228.len == 0) {
        return true;
      }
      if (*local_228.str != ':') {
        return true;
      }
      pSVar4->flags = pSVar4->flags & 0xffffff1fU | 0x80;
      _line_progressed(this,1);
      pSVar4 = this->m_state;
      pcVar1 = &(pSVar4->line_contents).rem;
      local_228 = *pcVar1;
      if ((pSVar4->line_contents).rem.len == 0) {
        return true;
      }
      cVar2 = *pcVar1->str;
      if (cVar2 != ' ') {
        lVar20 = 0;
        do {
          lVar26 = lVar20;
          if (lVar26 == 1) break;
          lVar20 = lVar26 + 1;
        } while (cVar2 != " \t"[lVar26 + 1]);
        if (lVar26 != 0) {
          return true;
        }
      }
      if ((pSVar4->line_contents).rem.str == (pSVar4->line_contents).full.str) {
        uStack_208 = 0x6c5f74615f20;
        uStack_202 = 0x69;
        uStack_201 = 0x6e;
        uStack_200 = 0x696765625f65;
        uStack_1fa = 0x6e;
        local_218.str = (char *)0x6166206b63656863;
        local_218.len._0_6_ = 0x203a64656c69;
        local_218.len._6_1_ = 0x28;
        local_218.len._7_1_ = 0x21;
        uStack_1f9 = 0x292928;
        if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
          pcVar5 = (code *)swi(3);
          uVar22 = (*pcVar5)();
          return (bool)uVar22;
        }
        local_138 = 0;
        uStack_130 = 0x7075;
        local_128 = 0;
        pcStack_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_118 = 0x65;
        LVar14.super_LineCol.col = 0;
        LVar14.super_LineCol.offset = SUB168(ZEXT816(0x7075) << 0x40,0);
        LVar14.super_LineCol.line = SUB168(ZEXT816(0x7075) << 0x40,8);
        LVar14.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar14.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_218,0x23,LVar14,(this->m_stack).m_callbacks.m_user_data);
      }
      chars.len = 2;
      chars.str = " \t";
      sVar24 = basic_substring<const_char>::first_not_of(&local_228,chars,0);
      if ((sVar24 != 0xffffffffffffffff) && (local_228.len < sVar24)) {
        if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
          pcVar5 = (code *)swi(3);
          uVar22 = (*pcVar5)();
          return (bool)uVar22;
        }
        handle_error(0x200e84,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1569,"pos <= len || pos == npos");
      }
      if (sVar24 == 0xffffffffffffffff) {
        local_218.str = local_228.str;
        local_218.len._0_6_ = (undefined6)local_228.len;
        local_218.len._6_1_ = local_228.len._6_1_;
        local_218.len._7_1_ = local_228.len._7_1_;
      }
      else {
        basic_substring<const_char>::basic_substring(&local_218,local_228.str,sVar24);
      }
      sVar24 = CONCAT17(local_218.len._7_1_,CONCAT16(local_218.len._6_1_,(undefined6)local_218.len))
      ;
      local_228.len = sVar24;
      local_228.str = local_218.str;
      goto LAB_001d5e49;
    }
    sVar24 = local_228.len;
    if (local_228.len != 0) {
      if (*local_228.str != ' ') {
        lVar20 = 0;
        do {
          lVar26 = lVar20;
          if (lVar26 == 1) break;
          lVar20 = lVar26 + 1;
        } while (*local_228.str != " \t"[lVar26 + 1]);
        if (lVar26 != 0) goto LAB_001d57a4;
      }
      chars_00.len = 2;
      chars_00.str = " \t";
      sVar24 = basic_substring<const_char>::first_not_of(&local_228,chars_00,0);
      if (sVar24 == 0xffffffffffffffff) {
        sVar24 = local_228.len;
      }
      goto LAB_001d5e49;
    }
LAB_001d57a4:
    iVar23 = basic_substring<const_char>::compare(&local_228,'?');
    if (iVar23 == 0) {
LAB_001d57fa:
      ahead = 1;
      if ((1 < sVar24) && (*local_228.str == '?')) {
        lVar20 = 0;
        do {
          lVar26 = lVar20;
          if (lVar26 == 1) break;
          lVar20 = lVar26 + 1;
        } while (local_228.str[lVar26 + 1] == "? "[lVar26 + 1]);
        ahead = 2 - (ulong)(lVar26 == 0);
      }
      _line_progressed(this,ahead);
      if ((this->m_state->flags & 0x200) != 0) {
        _append_key_val_null(this,local_228.str + -1);
      }
      this->m_state->flags = this->m_state->flags | 0x20;
      return true;
    }
    if ((1 < sVar24) && (*local_228.str == '?')) {
      lVar20 = 0;
      do {
        lVar26 = lVar20;
        if (lVar26 == 1) break;
        lVar20 = lVar26 + 1;
      } while (local_228.str[lVar26 + 1] == "? "[lVar26 + 1]);
      if (lVar26 != 0) goto LAB_001d57fa;
    }
    uVar3 = this->m_state->flags;
    if (((uVar3 & 0x20) != 0 && sVar24 != 0) && (*local_228.str == ':')) {
      if ((uVar3 >> 9 & 1) == 0) {
        _store_scalar_null(this,local_228.str);
      }
      this->m_state->flags = this->m_state->flags & 0xffffff1fU | 0x80;
      _line_progressed(this,1);
      pSVar4 = this->m_state;
      pcVar1 = &(pSVar4->line_contents).rem;
      local_228 = *pcVar1;
      if ((pSVar4->line_contents).rem.len == 0) {
        return true;
      }
      if (*pcVar1->str != ' ') {
        return true;
      }
      if ((pSVar4->line_contents).rem.str == (pSVar4->line_contents).full.str) {
        uStack_208 = 0x6c5f74615f20;
        uStack_202 = 0x69;
        uStack_201 = 0x6e;
        uStack_200 = 0x696765625f65;
        uStack_1fa = 0x6e;
        local_218.str = (char *)0x6166206b63656863;
        local_218.len._0_6_ = 0x203a64656c69;
        local_218.len._6_1_ = 0x28;
        local_218.len._7_1_ = 0x21;
        uStack_1f9 = 0x292928;
        if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
          pcVar5 = (code *)swi(3);
          uVar22 = (*pcVar5)();
          return (bool)uVar22;
        }
        local_160 = 0;
        uStack_158 = 0x7099;
        local_150 = 0;
        pcStack_148 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_140 = 0x65;
        LVar17.super_LineCol.col = 0;
        LVar17.super_LineCol.offset = SUB168(ZEXT816(0x7099) << 0x40,0);
        LVar17.super_LineCol.line = SUB168(ZEXT816(0x7099) << 0x40,8);
        LVar17.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar17.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_218,0x23,LVar17,(this->m_stack).m_callbacks.m_user_data);
      }
      if (((this->m_state->line_contents).rem.len == 0) ||
         (*(this->m_state->line_contents).rem.str != ' ')) {
        uStack_1e8 = 0x775f;
        uStack_1e6 = 0x69;
        uStack_1e5 = 0x292963286874;
        uStack_1f5 = 0x65722e7374;
        uStack_1f0 = 0x2e6d;
        uStack_1ee = 0x62;
        uStack_1ed = 0x736e696765;
        uStack_208 = 0x65746174735f;
        uStack_202 = 0x2d;
        uStack_201 = 0x3e;
        uStack_200 = 0x635f656e696c;
        uStack_1fa = 0x6f;
        uStack_1f9 = 0x6e65746e;
        local_218.str = (char *)0x6166206b63656863;
        local_218.len._0_6_ = 0x203a64656c69;
        local_218.len._6_1_ = 0x28;
        local_218.len._7_1_ = 0x6d;
        if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
          pcVar5 = (code *)swi(3);
          uVar22 = (*pcVar5)();
          return (bool)uVar22;
        }
        local_1d8.str = (char *)0x0;
        local_1d8.len = 0x6d66;
        local_1c8 = 0;
        pcStack_1c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_1b8 = 0x65;
        LVar18.super_LineCol.col = 0;
        LVar18.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
        LVar18.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
        LVar18.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        LVar18.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_218,0x3a,LVar18,(this->m_stack).m_callbacks.m_user_data);
      }
      sVar24 = basic_substring<const_char>::first_not_of(&(this->m_state->line_contents).rem,' ',0);
      if (sVar24 == 0xffffffffffffffff) {
        sVar24 = (this->m_state->line_contents).rem.len;
      }
      goto LAB_001d5e49;
    }
    iVar23 = basic_substring<const_char>::compare(&local_228,':');
    if (iVar23 == 0) {
LAB_001d5cf4:
      if ((uVar3 >> 9 & 1) == 0) {
        _store_scalar_null(this,local_228.str);
        this->m_state->flags = this->m_state->flags & 0xffffffdf;
      }
      this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
      iVar23 = basic_substring<const_char>::compare(&local_228,':');
      sVar24 = 2 - (ulong)(iVar23 == 0);
      goto LAB_001d5e49;
    }
    if ((1 < sVar24) && (*local_228.str == ':')) {
      lVar20 = 0;
      do {
        lVar26 = lVar20;
        if (lVar26 == 1) break;
        lVar20 = lVar26 + 1;
      } while (local_228.str[lVar26 + 1] == "\": "[lVar26 + 2]);
      if (lVar26 != 0) goto LAB_001d5cf4;
    }
    if (2 < sVar24) {
      if (*local_228.str == '.') {
        uVar19 = 0;
        do {
          uVar27 = uVar19;
          if (uVar27 == 2) break;
          uVar19 = uVar27 + 1;
        } while (local_228.str[uVar27 + 1] == "\t..."[uVar27 + 2]);
        if (1 < uVar27) goto LAB_001d5db2;
      }
      if ((2 < sVar24) && (*local_228.str == '-')) {
        uVar19 = 0;
        do {
          uVar27 = uVar19;
          if (uVar27 == 2) break;
          uVar19 = uVar27 + 1;
        } while (local_228.str[uVar27 + 1] == "---"[uVar27 + 1]);
        if (1 < uVar27) {
LAB_001d5fd6:
          rem.len = sVar24;
          rem.str = local_228.str;
          _start_new_doc(this,rem);
          return true;
        }
      }
    }
    bVar21 = _handle_types(this);
    if (bVar21) {
      return true;
    }
    bVar21 = _handle_key_anchors_and_refs(this);
    if (bVar21) {
      return true;
    }
    bVar21 = is_debugger_attached();
    if ((bVar21) && (bVar21 = is_debugger_attached(), bVar21)) {
      pcVar5 = (code *)swi(3);
      uVar22 = (*pcVar5)();
      return (bool)uVar22;
    }
LAB_001d603a:
    pcVar25 = "ERROR: parse error";
    sVar24 = 0x12;
LAB_001d4ff0:
    fmt.len = sVar24;
    fmt.str = pcVar25;
    _err<>(this,fmt);
    return false;
  }
  if (-1 < (char)uVar3) {
    bVar21 = is_debugger_attached();
    if ((bVar21) && (bVar21 = is_debugger_attached(), bVar21)) {
      pcVar5 = (code *)swi(3);
      uVar22 = (*pcVar5)();
      return (bool)uVar22;
    }
    pcVar25 = "ERROR: internal error";
    sVar24 = 0x15;
    goto LAB_001d4ff0;
  }
  if ((uVar3 >> 8 & 1) != 0) {
    uStack_208 = 0x6e6f6e5f7361;
    uStack_202 = 0x65;
    uStack_201 = 0x28;
    uStack_200 = 0x292954584e52;
    uStack_1fa = 0;
    local_218.str = (char *)0x6166206b63656863;
    local_218.len._0_6_ = 0x203a64656c69;
    local_218.len._6_1_ = 0x28;
    local_218.len._7_1_ = 0x68;
    if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
      pcVar5 = (code *)swi(3);
      uVar22 = (*pcVar5)();
      return (bool)uVar22;
    }
    local_188 = 0;
    uStack_180 = 0x70c7;
    local_178 = 0;
    pcStack_170 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_168 = 0x65;
    LVar15.super_LineCol.col = 0;
    LVar15.super_LineCol.offset = SUB168(ZEXT816(0x70c7) << 0x40,0);
    LVar15.super_LineCol.line = SUB168(ZEXT816(0x70c7) << 0x40,8);
    LVar15.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar15.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_218,0x1f,LVar15,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((this->m_state->flags & 0x40) != 0) {
    uStack_208 = 0x6e6f6e5f7361;
    uStack_202 = 0x65;
    uStack_201 = 0x28;
    uStack_200 = 0x292959454b52;
    uStack_1fa = 0;
    local_218.str = (char *)0x6166206b63656863;
    local_218.len._0_6_ = 0x203a64656c69;
    local_218.len._6_1_ = 0x28;
    local_218.len._7_1_ = 0x68;
    if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
      pcVar5 = (code *)swi(3);
      uVar22 = (*pcVar5)();
      return (bool)uVar22;
    }
    local_1b0 = 0;
    uStack_1a8 = 0x70c8;
    local_1a0 = 0;
    pcStack_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_190 = 0x65;
    LVar16.super_LineCol.col = 0;
    LVar16.super_LineCol.offset = SUB168(ZEXT816(0x70c8) << 0x40,0);
    LVar16.super_LineCol.line = SUB168(ZEXT816(0x70c8) << 0x40,8);
    LVar16.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar16.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_218,0x1f,LVar16,(this->m_stack).m_callbacks.m_user_data);
  }
  local_1d8.str = (char *)0x0;
  local_1d8.len = 0;
  bVar21 = _scan_scalar_map_blck(this,&local_1d8,&local_229);
  sVar24 = local_228.len;
  if (bVar21) {
    pSVar4 = this->m_state;
    pcVar1 = &(pSVar4->line_contents).rem;
    pcVar25 = pcVar1->str;
    uVar19 = (pSVar4->line_contents).rem.len;
    local_228 = *pcVar1;
    if ((1 < uVar19) && (*pcVar25 == ':')) {
      lVar20 = 0;
      do {
        lVar26 = lVar20;
        if (lVar26 == 1) break;
        lVar20 = lVar26 + 1;
      } while (pcVar25[lVar26 + 1] == "\": "[lVar26 + 2]);
      if (lVar26 != 0) {
        pSVar4->flags = pSVar4->flags & 0xffffff3fU | 0x40;
        _push_level(this,false);
        _move_scalar_from_top(this);
        _move_val_anchor_to_key_anchor(this);
        _start_map(this,true);
        _save_indentation(this,this->m_state->scalar_col);
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
LAB_001d58f6:
        sVar24 = 2;
        goto LAB_001d5e49;
      }
    }
    if ((uVar19 == 0) || (*pcVar25 != ':')) {
      val.len = local_1d8.len;
      val.str = local_1d8.str;
      _append_key_val(this,val,(uint)local_229);
      this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
      return true;
    }
    pSVar4->flags = pSVar4->flags & 0xffffff3fU | 0x40;
    _push_level(this,false);
    _move_scalar_from_top(this);
    _move_val_anchor_to_key_anchor(this);
    _start_map(this,true);
    _save_indentation(this,local_1d8.len);
    this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x80;
  }
  else {
    if ((1 < local_228.len) && (*local_228.str == '-')) {
      lVar20 = 0;
      do {
        lVar26 = lVar20;
        if (lVar26 == 1) break;
        lVar20 = lVar26 + 1;
      } while (local_228.str[lVar26 + 1] == "--- "[lVar26 + 3]);
      if (lVar26 != 0) {
        this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
        _push_level(this,false);
        _move_scalar_from_top(this);
        _start_seq(this,true);
        _save_indentation(this,0);
        goto LAB_001d58f6;
      }
    }
    iVar23 = basic_substring<const_char>::compare(&local_228,'-');
    if (iVar23 != 0) {
      if (sVar24 != 0) {
        if (*local_228.str == '[') {
          this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
          _push_level(this,true);
          _move_scalar_from_top(this);
          _start_seq(this,true);
          this->m_state->flags = this->m_state->flags | 0x10;
          goto LAB_001d5d64;
        }
        if (sVar24 != 0) {
          if (*local_228.str == '{') {
            this->m_state->flags = this->m_state->flags & 0xffffff3fU | 0x40;
            _push_level(this,true);
            _move_scalar_from_top(this);
            _start_map(this,true);
            this->m_state->flags = this->m_state->flags & 0xffffff2fU | 0x50;
            goto LAB_001d5d64;
          }
          if ((sVar24 != 0) && (*local_228.str == ' ')) {
            sVar24 = basic_substring<const_char>::first_not_of(&local_228,' ',0);
            if ((sVar24 != 0xffffffffffffffff) && (local_228.len < sVar24)) {
              if (((s_error_flags & 1) != 0) && (bVar21 = is_debugger_attached(), bVar21)) {
                pcVar5 = (code *)swi(3);
                uVar22 = (*pcVar5)();
                return (bool)uVar22;
              }
              handle_error(0x200e84,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1569,"pos <= len || pos == npos");
            }
            if (sVar24 == 0xffffffffffffffff) {
              local_218.str = local_228.str;
              local_218.len._0_6_ = (undefined6)local_228.len;
              local_218.len._6_1_ = local_228.len._6_1_;
              local_218.len._7_1_ = local_228.len._7_1_;
            }
            else {
              basic_substring<const_char>::basic_substring(&local_218,local_228.str,sVar24);
            }
            sVar24 = CONCAT17(local_218.len._7_1_,
                              CONCAT16(local_218.len._6_1_,(undefined6)local_218.len));
            goto LAB_001d5e49;
          }
        }
      }
      bVar21 = _handle_types(this);
      if (bVar21) {
        return true;
      }
      bVar21 = _handle_val_anchors_and_refs(this);
      if (bVar21) {
        return true;
      }
      sVar24 = local_228.len;
      if ((3 < local_228.len) && (*local_228.str == '-')) {
        uVar19 = 0;
        do {
          uVar27 = uVar19;
          if (uVar27 == 3) break;
          uVar19 = uVar27 + 1;
        } while (local_228.str[uVar27 + 1] == "--- "[uVar27 + 1]);
        if (2 < uVar27) goto LAB_001d5fd6;
      }
      iVar23 = basic_substring<const_char>::compare(&local_228,"---",3);
      if (iVar23 == 0) goto LAB_001d5fd6;
      if ((3 < sVar24) && (*local_228.str == '-')) {
        uVar19 = 0;
        do {
          uVar27 = uVar19;
          if (uVar27 == 3) break;
          uVar19 = uVar27 + 1;
        } while (local_228.str[uVar27 + 1] == "---\t"[uVar27 + 1]);
        if (2 < uVar27) goto LAB_001d5fd6;
      }
      if ((2 < sVar24) && (*local_228.str == '.')) {
        uVar19 = 0;
        do {
          uVar27 = uVar19;
          if (uVar27 == 2) break;
          uVar19 = uVar27 + 1;
        } while (local_228.str[uVar27 + 1] == "\t..."[uVar27 + 2]);
        if (1 < uVar27) {
LAB_001d5db2:
          _end_stream(this);
          sVar24 = 3;
          goto LAB_001d5e49;
        }
      }
      bVar21 = is_debugger_attached();
      if ((bVar21) && (bVar21 = is_debugger_attached(), bVar21)) {
        pcVar5 = (code *)swi(3);
        uVar22 = (*pcVar5)();
        return (bool)uVar22;
      }
      goto LAB_001d603a;
    }
    _push_level(this,false);
    _move_scalar_from_top(this);
    _save_indentation(this,0);
  }
LAB_001d5d64:
  sVar24 = 1;
LAB_001d5e49:
  _line_progressed(this,sVar24);
  return true;
}

Assistant:

bool Parser::_handle_map_blck()
{
    _c4dbgpf("handle_map_blck: node_id={}  level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RMAP));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(FLOW));

    if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment();
        return true;
    }

    if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        // actually, we don't need RNXT in indent-based maps.
        addrem_flags(RKEY, RNXT);
    }

    if(_handle_indentation())
    {
        _c4dbgp("indentation token");
        return true;
    }

    if(has_any(RKEY))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));

        _c4dbgp("RMAP|RKEY read scalar?");
        bool is_quoted;
        if(_scan_scalar_map_blck(&rem, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");
            if(has_all(QMRK|SSCL))
            {
                _c4dbgpf("current key is QMRK; SSCL is set. so take store scalar='{}' as key and add an empty val", m_state->scalar);
                _append_key_val_null(rem.str - 1);
            }
            _store_scalar(rem, is_quoted);
            if(has_all(QMRK|RSET))
            {
                _c4dbgp("it's a complex key, so use null value '~'");
                _append_key_val_null(rem.str);
            }
            rem = m_state->line_contents.rem;

            if(rem.begins_with(':'))
            {
                _c4dbgp("wait for val");
                addrem_flags(RVAL, RKEY|QMRK);
                _line_progressed(1);
                rem = m_state->line_contents.rem;
                if(rem.begins_with_any(" \t"))
                {
                    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
                    rem = rem.left_of(rem.first_not_of(" \t"));
                    _c4dbgpf("skip {} spaces/tabs", rem.len);
                    _line_progressed(rem.len);
                }
            }
            return true;
        }
        else if(rem.begins_with_any(" \t"))
        {
            size_t pos = rem.first_not_of(" \t");
            if(pos == npos)
                pos = rem.len;
            _c4dbgpf("skip {} spaces/tabs", pos);
            _line_progressed(pos);
            return true;
        }
        else if(rem == '?' || rem.begins_with("? "))
        {
            _c4dbgp("it's a complex key");
            _line_progressed(rem.begins_with("? ") ? 2u : 1u);
            if(has_any(SSCL))
                _append_key_val_null(rem.str - 1);
            add_flags(QMRK);
            return true;
        }
        else if(has_all(QMRK) && rem.begins_with(':'))
        {
            _c4dbgp("complex key finished");
            if(!has_any(SSCL))
                _store_scalar_null(rem.str);
            addrem_flags(RVAL, RKEY|QMRK);
            _line_progressed(1);
            rem = m_state->line_contents.rem;
            if(rem.begins_with(' '))
            {
                _RYML_CB_ASSERT(m_stack.m_callbacks,  ! _at_line_begin());
                _skipchars(' ');
            }
            return true;
        }
        else if(rem == ':' || rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgp("key finished");
            if(!has_all(SSCL))
            {
                _c4dbgp("key was empty...");
                _store_scalar_null(rem.str);
                rem_flags(QMRK);
            }
            addrem_flags(RVAL, RKEY);
            _line_progressed(rem == ':' ? 1 : 2);
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("end current document");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else if(rem.begins_with("---"))
        {
            _c4dbgp("start new document '---'");
            _start_new_doc(rem);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_key_anchors_and_refs())
        {
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));

        _c4dbgp("RMAP|RVAL read scalar?");
        csubstr s;
        bool is_quoted;
        if(_scan_scalar_map_blck(&s, &is_quoted)) // this also progresses the line
        {
            _c4dbgpf("it's a{} scalar", is_quoted ? " quoted" : "");

            rem = m_state->line_contents.rem;

            if(rem.begins_with(": "))
            {
                _c4dbgp("actually, the scalar is the first key of a map");
                addrem_flags(RKEY, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _move_scalar_from_top();
                _move_val_anchor_to_key_anchor();
                _start_map();
                _save_indentation(m_state->scalar_col);
                addrem_flags(RVAL, RKEY);
                _line_progressed(2);
            }
            else if(rem.begins_with(':'))
            {
                _c4dbgp("actually, the scalar is the first key of a map, and it opens a new scope");
                addrem_flags(RKEY, RVAL); // before _push_level! This prepares the current level for popping by setting it to RNXT
                _push_level();
                _move_scalar_from_top();
                _move_val_anchor_to_key_anchor();
                _start_map();
                _save_indentation(/*behind*/s.len);
                addrem_flags(RVAL, RKEY);
                _line_progressed(1);
            }
            else
            {
                _c4dbgp("appending keyval to current map");
                _append_key_val(s, is_quoted);
                addrem_flags(RKEY, RVAL);
            }
            return true;
        }
        else if(rem.begins_with("- ") _RYML_WITH_TAB_TOKENS( || rem.begins_with("-\t")))
        {
            _c4dbgp("val is a nested seq, indented");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level();
            _move_scalar_from_top();
            _start_seq();
            _save_indentation();
            _line_progressed(2);
            return true;
        }
        else if(rem == '-')
        {
            _c4dbgp("maybe a seq. start unknown, indented");
            _start_unk();
            _save_indentation();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq, flow");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map, flow");
            addrem_flags(RKEY, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _move_scalar_from_top();
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(' '))
        {
            csubstr spc = rem.left_of(rem.first_not_of(' '));
            if(_at_line_begin())
            {
                _c4dbgpf("skipping value indentation: {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
            else
            {
                _c4dbgpf("skipping {} spaces", spc.len);
                _line_progressed(spc.len);
                return true;
            }
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with("--- ") || rem == "---" || rem.begins_with("---\t"))
        {
            _start_new_doc(rem);
            return true;
        }
        else if(rem.begins_with("..."))
        {
            _c4dbgp("end current document");
            _end_stream();
            _line_progressed(3);
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return false;
}